

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkparts.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  undefined8 uVar2;
  uint uVar3;
  stream *psVar5;
  bool_t bVar6;
  ebml_context *peVar7;
  filepos_t fVar8;
  fourcc_t fVar4;
  ebml_element *Element;
  filepos_t fVar9;
  node *pnVar10;
  bool bVar11;
  SegmentStart *seg;
  size_t j;
  tchar_t Ext [256];
  tchar_t String [1024];
  tchar_t Original [1024];
  tchar_t OutPath [1024];
  filepos_t local_630;
  SegmentStart currSegment;
  ebml_element *Segment;
  array SegmentStarts;
  int UpperElement;
  int i;
  ebml_parser_context RContext;
  ebml_element *EbmlHead;
  tchar_t Path [1024];
  stream *local_1c0;
  stream *Output;
  stream *Input;
  textwriter _StdErr;
  parsercontext p;
  int ShowVersion;
  int ShowUsage;
  int Result;
  char **argv_local;
  int argc_local;
  
  ShowVersion = 0;
  bVar1 = false;
  bVar11 = false;
  Output = (stream *)0x0;
  local_1c0 = (stream *)0x0;
  RContext.Profile = 0;
  RContext._28_4_ = 0;
  ParserContext_Init((parsercontext *)&_StdErr.InsideContent,(nodemeta *)0x0,(cc_memheap *)0x0,
                     (cc_memheap *)0x0);
  (**(code **)(p.Base.Base.Base._0_8_ + 0x40))(&_StdErr.InsideContent,0x101,4,"Matroska");
  (**(code **)(p.Base.Base.Base._0_8_ + 0x40))(&_StdErr.InsideContent,0x102,4,"0.1.0");
  (**(code **)(p.Base.Base.Base._0_8_ + 0x40))(&_StdErr.InsideContent,0x100,4,"mkparts");
  MATROSKA_Init((parsercontext *)&_StdErr.InsideContent);
  Segment = (ebml_element *)0x0;
  SegmentStarts._Begin = (char *)0x0;
  StdErr = (textwriter *)&Input;
  memset(StdErr,0,0x38);
  psVar5 = (stream *)NodeSingleton(&_StdErr.InsideContent,0x45445453);
  StdErr->Stream = psVar5;
  if (StdErr->Stream == (stream *)0x0) {
    __assert_fail("StdErr->Stream!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/mkparts/mkparts.c"
                  ,0xac,"int main(int, const char **)");
  }
  for (SegmentStarts._Used._4_4_ = 1; SegmentStarts._Used._4_4_ < argc;
      SegmentStarts._Used._4_4_ = SegmentStarts._Used._4_4_ + 1) {
    Node_FromStr(&_StdErr.InsideContent,(tchar_t *)&EbmlHead,0x400,argv[SegmentStarts._Used._4_4_]);
    bVar6 = tcsisame_ascii((tchar_t *)&EbmlHead,"--split");
    if (bVar6 == 0) {
      bVar6 = tcsisame_ascii((tchar_t *)&EbmlHead,"--version");
      if (bVar6 == 0) {
        bVar6 = tcsisame_ascii((tchar_t *)&EbmlHead,"--quiet");
        if (bVar6 == 0) {
          bVar6 = tcsisame_ascii((tchar_t *)&EbmlHead,"--help");
          if (bVar6 == 0) {
            if (SegmentStarts._Used._4_4_ < argc + -1) {
              TextPrintf((textwriter_conflict *)StdErr,"Unknown parameter \'%s\'\r\n",&EbmlHead);
            }
          }
          else {
            bVar11 = true;
            bVar1 = true;
          }
        }
        else {
          Quiet = 1;
        }
      }
      else {
        bVar11 = true;
      }
    }
    else {
      Split = 1;
    }
  }
  if ((argc < 2) || (bVar11)) {
    TextWrite((textwriter_conflict *)StdErr,
              "mkparts v0.1.0, Copyright (c) 2011-2020 Matroska Foundation\r\n");
    if ((argc < 2) || (bVar1)) {
      ShowVersion = OutputError(1,"Usage: mkparts [options] <matroska_src>");
      TextWrite((textwriter_conflict *)StdErr,"Options:\r\n");
      TextWrite((textwriter_conflict *)StdErr,
                "  --split     split concatenated segments into different files\r\n");
      TextWrite((textwriter_conflict *)StdErr,
                "  --quiet     don\'t ouput progress and file info\r\n");
      TextWrite((textwriter_conflict *)StdErr,"  --version   show the version of mkparts\r\n");
      TextWrite((textwriter_conflict *)StdErr,"  --help      show this screen\r\n");
    }
  }
  else {
    Node_FromStr(&_StdErr.InsideContent,(tchar_t *)&EbmlHead,0x400,argv[argc + -1]);
    Output = StreamOpen(&_StdErr.InsideContent,(tchar_t *)&EbmlHead,1);
    if (Output == (stream *)0x0) {
      TextPrintf((textwriter_conflict *)StdErr,"Could not open file \"%s\" for reading\r\n",
                 &EbmlHead);
      ShowVersion = -2;
    }
    else if (Split == 0) {
      TextPrintf((textwriter_conflict *)StdErr,
                 "Only the --split option is supported for the moment\r\n");
      ShowVersion = -3;
    }
    else {
      _UpperElement = MATROSKA_getContextStream();
      RContext.UpContext = (ebml_parser_context *)0xffffffffffffffff;
      RContext.Context = (ebml_context *)0x0;
      RContext.EndPosition._0_4_ = 0xffffffff;
      RContext._24_8_ =
           EBML_FindNextElement
                     (Output,(ebml_parser_context *)&UpperElement,(int *)&SegmentStarts._Used,0);
      while (uVar2 = RContext._24_8_, RContext._24_8_ != 0) {
        currSegment.SegmentSize = 0;
        peVar7 = MATROSKA_getContextSegment();
        bVar6 = EBML_ElementIsType((ebml_element *)uVar2,peVar7);
        uVar2 = RContext._24_8_;
        if (bVar6 == 0) {
          peVar7 = EBML_getContextHead();
          bVar6 = EBML_ElementIsType((ebml_element *)uVar2,peVar7);
          if (bVar6 == 0) {
            fVar4 = EBML_ElementClassID((ebml_element *)RContext._24_8_);
            fVar8 = EBML_ElementPosition((ebml_element *)RContext._24_8_);
            uVar3 = OutputWarning(3,"Unknown element %x at %ld in %s",(ulong)fVar4,fVar8,&EbmlHead);
            ShowVersion = uVar3 | ShowVersion;
          }
        }
        else {
          fVar8 = EBML_ElementPosition((ebml_element *)RContext._24_8_);
          uVar3 = OutputWarning(3,"Matroska Segment at %ld in %s without an EBML header",fVar8,
                                &EbmlHead);
          ShowVersion = uVar3 | ShowVersion;
        }
        if (Quiet == 0) {
          TextWrite((textwriter_conflict *)StdErr,".");
        }
        do {
          Element = EBML_FindNextElement
                              (Output,(ebml_parser_context *)&UpperElement,
                               (int *)&SegmentStarts._Used,0);
          currSegment.SegmentSize = (filepos_t)Element;
          peVar7 = EBML_getContextHead();
          bVar6 = EBML_ElementIsType(Element,peVar7);
          if (bVar6 != 0) {
            fVar8 = EBML_ElementPosition((ebml_element *)currSegment.SegmentSize);
            fVar9 = EBML_ElementPosition((ebml_element *)RContext._24_8_);
            uVar3 = OutputWarning(3,
                                  "Found a new EBML header at %ld instead of a segment after EBML Header at %ld in %s"
                                  ,fVar8,fVar9,&EbmlHead);
            ShowVersion = uVar3 | ShowVersion;
            RContext._24_8_ = currSegment.SegmentSize;
          }
          fVar8 = currSegment.SegmentSize;
          bVar11 = false;
          if (currSegment.SegmentSize != 0) {
            peVar7 = MATROSKA_getContextSegment();
            bVar6 = EBML_ElementIsType((ebml_element *)fVar8,peVar7);
            bVar11 = bVar6 == 0;
          }
          fVar8 = currSegment.SegmentSize;
        } while (bVar11);
        if (currSegment.SegmentSize != 0) {
          peVar7 = MATROSKA_getContextSegment();
          bVar6 = EBML_ElementIsType((ebml_element *)fVar8,peVar7);
          uVar2 = RContext._24_8_;
          if ((bVar6 != 0) && (RContext._24_8_ != 0)) {
            peVar7 = EBML_getContextHead();
            bVar6 = EBML_ElementIsType((ebml_element *)uVar2,peVar7);
            if (bVar6 != 0) {
              local_630 = EBML_ElementPosition((ebml_element *)RContext._24_8_);
              currSegment.EbmlSize = EBML_ElementPosition((ebml_element *)currSegment.SegmentSize);
              bVar6 = EBML_ElementIsFiniteSize((ebml_element *)RContext._24_8_);
              if (bVar6 == 0) {
                fVar8 = EBML_ElementPosition((ebml_element *)currSegment.SegmentSize);
                fVar9 = EBML_ElementPosition((ebml_element *)RContext._24_8_);
                currSegment.EbmlHeadPos = fVar8 - fVar9;
              }
              else {
                currSegment.EbmlHeadPos = EBML_ElementFullSize((ebml_element *)RContext._24_8_,1);
              }
              NodeDelete((node *)RContext._24_8_);
              RContext._24_8_ =
                   EBML_ElementSkipData
                             ((ebml_element *)currSegment.SegmentSize,Output,
                              (ebml_parser_context *)&UpperElement,(ebml_element *)0x0,1);
              bVar6 = EBML_ElementIsFiniteSize((ebml_element *)currSegment.SegmentSize);
              if (bVar6 == 0) {
                if (RContext._24_8_ == 0) {
                  if (Output == (stream *)0x0) {
                    __assert_fail("(const void*)(Input)!=NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/mkparts/mkparts.c"
                                  ,0x10f,"int main(int, const char **)");
                  }
                  currSegment.SegmentPos =
                       (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
                }
                else {
                  fVar8 = EBML_ElementPosition((ebml_element *)RContext._24_8_);
                  fVar9 = EBML_ElementPosition((ebml_element *)currSegment.SegmentSize);
                  currSegment.SegmentPos = fVar8 - fVar9;
                }
              }
              else {
                currSegment.SegmentPos =
                     EBML_ElementFullSize((ebml_element *)currSegment.SegmentSize,1);
              }
              NodeDelete((node *)currSegment.SegmentSize);
              ArrayAppend((array *)&Segment,&local_630,0x20,0);
            }
          }
        }
        if (RContext._24_8_ == 0) {
          RContext._24_8_ =
               EBML_FindNextElement
                         (Output,(ebml_parser_context *)&UpperElement,(int *)&SegmentStarts._Used,0)
          ;
        }
      }
      if (Quiet == 0) {
        TextWrite((textwriter_conflict *)StdErr,"\r\n");
      }
      if ((ulong)SegmentStarts._Begin >> 5 == 0) {
        ShowVersion = OutputError(3,"No segment found in %s",&EbmlHead);
      }
      else if ((ulong)SegmentStarts._Begin >> 5 == 1) {
        ShowVersion = OutputWarning(3,"Only one segment found in %s, do nothing",&EbmlHead);
      }
      else {
        for (seg = (SegmentStart *)0x0; seg < (SegmentStart *)((ulong)SegmentStarts._Begin >> 5);
            seg = (SegmentStart *)((long)&seg->EbmlHeadPos + 1)) {
          pnVar10 = &(Segment->Base).Base + (long)seg;
          if (Quiet == 0) {
            fVar8._0_4_ = pnVar10->FourCC;
            fVar8._4_4_ = pnVar10->Magic;
            TextPrintf((textwriter_conflict *)StdErr,
                       "write segment %zu from %s %ld size %ld in %s\r\n",seg,&EbmlHead,fVar8,
                       (long)pnVar10->VMT + pnVar10->RefCount,&EbmlHead);
          }
          SplitPath((tchar_t *)&EbmlHead,String + 0x3f8,0x400,Ext + 0xf8,0x400,(tchar_t *)&j,0x100);
          if (String[0x3f8] == '\0') {
            Original[0x3f8] = '\0';
          }
          else {
            tcscpy_s(Original + 0x3f8,0x400,String + 0x3f8);
            AddPathDelimiter(Original + 0x3f8,0x400);
          }
          if ((char)j == '\0') {
            stcatprintf_s(Original + 0x3f8,0x400,"%zu.%s",seg,Ext + 0xf8);
          }
          else {
            stcatprintf_s(Original + 0x3f8,0x400,"%s.%zu.%s",Ext + 0xf8,seg,&j);
          }
          local_1c0 = StreamOpen(&_StdErr.InsideContent,Original + 0x3f8,6);
          if (local_1c0 == (stream *)0x0) {
            ShowVersion = OutputError(5,"Could not open file \"%s\" for writing\r\n",
                                      Original + 0x3f8);
            break;
          }
          fVar9._0_4_ = pnVar10->FourCC;
          fVar9._4_4_ = pnVar10->Magic;
          CopyTo(Output,local_1c0,fVar9,(filepos_t)pnVar10->VMT);
          CopyTo(Output,local_1c0,(filepos_t)pnVar10->Data,pnVar10->RefCount);
          StreamClose(local_1c0);
        }
      }
    }
  }
  ArrayClear((array *)&Segment);
  if (Output != (stream *)0x0) {
    StreamClose(Output);
  }
  if (local_1c0 != (stream *)0x0) {
    StreamClose(local_1c0);
  }
  ParserContext_Done((parsercontext *)&_StdErr.InsideContent);
  return ShowVersion;
}

Assistant:

int main(int argc, const char *argv[])
{
    int Result = 0;
    int ShowUsage = 0;
    int ShowVersion = 0;
    parsercontext p;
    textwriter _StdErr;
    struct stream *Input = NULL, *Output = NULL;
    tchar_t Path[MAXPATHFULL];
    ebml_element *EbmlHead = NULL;
    ebml_parser_context RContext;
    int i,UpperElement;
    array SegmentStarts;

    // Core-C init phase
    ParserContext_Init(&p,NULL,NULL,NULL);
    Node_SetData(&p.Base.Base.Base,NODECONTEXT_PROJECT_VENDOR,TYPE_STRING,"Matroska");
    Node_SetData(&p.Base.Base.Base,NODECONTEXT_PROJECT_VERSION,TYPE_STRING,PROJECT_VERSION);
    Node_SetData(&p.Base.Base.Base,NODECONTEXT_PROJECT_NAME,TYPE_STRING,PROJECT_NAME);

    // EBML & Matroska Init
    MATROSKA_Init(&p);

    ArrayInit(&SegmentStarts);

    StdErr = &_StdErr;
    memset(StdErr,0,sizeof(_StdErr));
    StdErr->Stream = (struct stream*)NodeSingleton(&p,STDERR_ID);
    assert(StdErr->Stream!=NULL);

	for (i=1;i<argc;++i)
	{
	    Node_FromStr(&p,Path,TSIZEOF(Path),argv[i]);
		if (tcsisame_ascii(Path,T("--split"))) Split = 1;
		else if (tcsisame_ascii(Path,T("--version"))) ShowVersion = 1;
		else if (tcsisame_ascii(Path,T("--quiet"))) Quiet = 1;
        else if (tcsisame_ascii(Path,T("--help"))) {ShowVersion = 1; ShowUsage = 1;}
		else if (i<argc-1) TextPrintf(StdErr,T("Unknown parameter '%s'\r\n"),Path);
	}

    if (argc < 2 || ShowVersion)
    {
        TextWrite(StdErr,PROJECT_NAME T(" v") PROJECT_VERSION T(", Copyright (c) 2011-2020 Matroska Foundation\r\n"));
        if (argc < 2 || ShowUsage)
        {
            Result = OutputError(1,T("Usage: ") PROJECT_NAME T(" [options] <matroska_src>"));
		    TextWrite(StdErr,T("Options:\r\n"));
		    TextWrite(StdErr,T("  --split     split concatenated segments into different files\r\n"));
            TextWrite(StdErr,T("  --quiet     don't ouput progress and file info\r\n"));
            TextWrite(StdErr,T("  --version   show the version of ") PROJECT_NAME T("\r\n"));
            TextWrite(StdErr,T("  --help      show this screen\r\n"));
        }
        goto exit;
    }

    Node_FromStr(&p,Path,TSIZEOF(Path),argv[argc-1]);
    Input = StreamOpen(&p,Path,SFLAG_RDONLY/*|SFLAG_BUFFERED*/);
    if (!Input)
    {
        TextPrintf(StdErr,T("Could not open file \"%s\" for reading\r\n"),Path);
        Result = -2;
        goto exit;
    }

    if (!Split)
    {
        TextPrintf(StdErr,T("Only the --split option is supported for the moment\r\n"));
        Result = -3;
        goto exit;
    }

    // parse the source file to determine if it's a Matroska file and determine the location of the key parts
    RContext.Context = MATROSKA_getContextStream();
    RContext.EndPosition = INVALID_FILEPOS_T;
    RContext.UpContext = NULL;
    RContext.Profile = EBML_ANY_PROFILE;

    EbmlHead = EBML_FindNextElement(Input, &RContext, &UpperElement, 0);
    while (EbmlHead!=NULL)
    {
        // parse the list of EBML header+segment start points in memory
        ebml_element *Segment = NULL;

        if (EL_Type(EbmlHead, MATROSKA_getContextSegment()))
        {
            Result |= OutputWarning(3,T("Matroska Segment at %") TPRId64 T(" in %s without an EBML header"),EBML_ElementPosition(EbmlHead), Path);
            // TODO: if there is an existing EBML head before in the file, use it
            //       otherwise create an EBML head with best guess
        }
        else if (!EL_Type(EbmlHead, EBML_getContextHead()))
        {
            Result |= OutputWarning(3,T("Unknown element %x at %") TPRId64 T(" in %s"), EBML_ElementClassID(EbmlHead), EBML_ElementPosition(EbmlHead), Path);
            // TODO: if there is an existing EBML head before in the file, use it
            //       otherwise create an EBML head with best guess
        }

        if (!Quiet) TextWrite(StdErr,T("."));

        do {
            Segment = EBML_FindNextElement(Input, &RContext, &UpperElement, 0);
            if (EL_Type(Segment, EBML_getContextHead()))
            {
                Result |= OutputWarning(3,T("Found a new EBML header at %") TPRId64 T(" instead of a segment after EBML Header at %") TPRId64 T(" in %s"), EBML_ElementPosition(Segment), EBML_ElementPosition(EbmlHead), Path);
                EbmlHead = Segment;
            }
        } while (Segment!=NULL && !EL_Type(Segment, MATROSKA_getContextSegment()));

        if (Segment!=NULL && EL_Type(Segment, MATROSKA_getContextSegment()) && EbmlHead!=NULL && EL_Type(EbmlHead, EBML_getContextHead()))
        {
            SegmentStart currSegment;
            currSegment.EbmlHeadPos = EBML_ElementPosition(EbmlHead);
            currSegment.SegmentPos = EBML_ElementPosition(Segment);

            if (EBML_ElementIsFiniteSize(EbmlHead))
                currSegment.EbmlSize = EBML_ElementFullSize(EbmlHead, 1);
            else
                currSegment.EbmlSize = EBML_ElementPosition(Segment) - EBML_ElementPosition(EbmlHead); // TODO: we should write the proper size in the header if there is enough room
            NodeDelete((node*)EbmlHead);

            EbmlHead = EBML_ElementSkipData(Segment, Input, &RContext, NULL, 1);

            if (EBML_ElementIsFiniteSize(Segment))
                currSegment.SegmentSize = EBML_ElementFullSize(Segment, 1);
            else { // TODO: we should write the proper size in the segment if there is enough room
                if (EbmlHead!=NULL)
                    currSegment.SegmentSize = EBML_ElementPosition(EbmlHead) - EBML_ElementPosition(Segment);
                else
                    currSegment.SegmentSize = Stream_Seek(Input,0,SEEK_CUR);
            }
            NodeDelete((node*)Segment);

            ArrayAppend(&SegmentStarts, &currSegment, sizeof(currSegment), 0);
        }

        if (EbmlHead==NULL)
            EbmlHead = EBML_FindNextElement(Input, &RContext, &UpperElement, 0);
    }

    if (!Quiet) TextWrite(StdErr,T("\r\n"));

    if (ARRAYCOUNT(SegmentStarts, SegmentStart)==0)
        Result = OutputError(3,T("No segment found in %s"), Path);
    else if (ARRAYCOUNT(SegmentStarts, SegmentStart)==1)
        Result = OutputWarning(3,T("Only one segment found in %s, do nothing"), Path);
    else {
        tchar_t OutPath[MAXPATHFULL];
        tchar_t Original[MAXLINE], String[MAXLINE], Ext[MAXDATA];

        // TODO: copy each segment in a separate file
        for (size_t j=0; j<ARRAYCOUNT(SegmentStarts, SegmentStart); ++j)
        {
            SegmentStart *seg = ARRAYBEGIN(SegmentStarts, SegmentStart)+j;
            if (!Quiet) TextPrintf(StdErr,T("write segment %zu from %s %") TPRId64 T(" size %") TPRId64 T(" in %s\r\n"), j, Path, seg->EbmlHeadPos, seg->EbmlSize+seg->SegmentSize, Path);

            SplitPath(Path,Original,TSIZEOF(Original),String,TSIZEOF(String),Ext,TSIZEOF(Ext));
            if (!Original[0])
                OutPath[0] = 0;
            else
            {
                tcscpy_s(OutPath,TSIZEOF(OutPath),Original);
                AddPathDelimiter(OutPath,TSIZEOF(OutPath));
            }
            if (Ext[0])
                stcatprintf_s(OutPath,TSIZEOF(OutPath),T("%s.%zu.%s"),String,j,Ext);
            else
                stcatprintf_s(OutPath,TSIZEOF(OutPath),T("%zu.%s"),j,String);

            Output = StreamOpen(&p,OutPath,SFLAG_WRONLY|SFLAG_CREATE);
            if (!Output)
            {
                Result = OutputError(5,T("Could not open file \"%s\" for writing\r\n"),OutPath);
                goto exit;
            }

            CopyTo(Input, Output, seg->EbmlHeadPos, seg->EbmlSize);
            CopyTo(Input, Output, seg->SegmentPos, seg->SegmentSize);

            StreamClose(Output);
        }
    }

exit:
    ArrayClear(&SegmentStarts);
    if (Input)
        StreamClose(Input);
    if (Output)
        StreamClose(Output);

    // Core-C ending
    ParserContext_Done(&p);

    return Result;
}